

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O1

ip_tables_t * parse_tables(char *path)

{
  char cVar1;
  list_head *plVar2;
  code *pcVar3;
  _func_int_void_ptr_char_ptr_ptr *p_Var4;
  double dVar5;
  bool bVar6;
  byte bVar7;
  char *__nptr;
  int iVar8;
  uint uVar9;
  int iVar10;
  FILE *__stream;
  ip_tables_t *piVar11;
  char *pcVar12;
  ip_chain_t *piVar13;
  ip_target_t *piVar14;
  size_t sVar15;
  long lVar16;
  long *plVar17;
  void *pvVar18;
  byte bVar19;
  ip_target_map_t *piVar20;
  ip_match_map_t *piVar21;
  bool bVar22;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 uVar23;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Da_25;
  undefined4 extraout_XMM0_Da_26;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 uVar24;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  char name [32];
  char line [1024];
  ip_rule_t *local_4d8;
  ip_table_t *local_4d0;
  char *local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  long *local_490;
  char *local_488;
  char *local_480;
  in_addr *local_478;
  in_addr *local_470;
  in_addr *local_468;
  in_addr *local_460;
  list_head *local_458;
  list_head *local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  char local_438;
  undefined7 uStack_437;
  
  __stream = fopen(path,"r");
  memset(&local_438,0,0x400);
  if (__stream == (FILE *)0x0) {
    piVar11 = (ip_tables_t *)0x0;
    _log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  else {
    piVar11 = (ip_tables_t *)new(0x20);
    pcVar12 = fgets(&local_438,0x400,__stream);
    if (pcVar12 != (char *)0x0) {
      local_4d0 = (ip_table_t *)0x0;
      bVar22 = false;
      do {
        while ((local_438 != '#' && (local_438 != '\n'))) {
          bVar6 = false;
          if (CONCAT71(uStack_437,local_438) != 0xa54494d4d4f43 || !bVar22) {
            if (local_438 == '*' && !bVar22) {
              local_4b8 = (char *)0x0;
              uStack_4b0 = 0;
              iVar8 = __isoc99_sscanf(&local_438,"*%15s",&local_4b8);
              uVar23 = extraout_XMM0_Da_02;
              uVar24 = extraout_XMM0_Db_02;
              if (iVar8 == 1) {
                iVar8 = map_int_get_v((char *)&local_4b8,m_table);
                if (iVar8 == 4) {
                  dVar5 = _log((double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
                  uVar23 = SUB84(dVar5,0);
                  uVar24 = (undefined4)((ulong)dVar5 >> 0x20);
                  goto LAB_00103b98;
                }
                local_4d0 = (ip_table_t *)new(0x38);
                (local_4d0->child_chains).prev = &local_4d0->child_chains;
                (local_4d0->child_chains).next = &local_4d0->child_chains;
                piVar11->tables[iVar8] = local_4d0;
                uVar23 = extraout_XMM0_Da_25;
                uVar24 = extraout_XMM0_Db_25;
              }
              else {
LAB_00103b98:
                local_4d0 = (ip_table_t *)0x0;
              }
              bVar6 = true;
              if (local_4d0 != (ip_table_t *)0x0) goto LAB_0010411b;
              bVar6 = false;
              local_4d0 = (ip_table_t *)0x0;
            }
            else {
              if (local_438 == ':' && bVar22) {
                local_4a8 = 0;
                uStack_4a0 = 0;
                local_4b8 = (char *)0x0;
                uStack_4b0 = 0;
                local_448 = 0;
                uStack_440 = 0;
                iVar8 = __isoc99_sscanf(&local_438,":%31s %15s",&local_4b8,&local_448);
                if (iVar8 == 2) {
                  local_4d8 = (ip_rule_t *)new(0x48);
                  _strlcpy((char *)local_4d8,(char *)&local_4b8,0x20);
                  iVar8 = map_int_get_v((char *)&local_448,m_target);
                  *(int *)(local_4d8->in + 8) = iVar8;
                  pcVar12 = local_4d8->out;
                  *(char **)(local_4d8->out + 8) = pcVar12;
                  *(char **)local_4d8->out = pcVar12;
                  local_4d8->target_ext = (ip_target_t *)&local_4d8->proto;
                  *(uint8_t **)&local_4d8->proto = &local_4d8->proto;
                  iVar8 = map_int_get_v((char *)local_4d8,m_chain);
                  uVar23 = extraout_XMM0_Da_01;
                  uVar24 = extraout_XMM0_Db_01;
                  if (iVar8 == 5) {
                    plVar2 = (local_4d0->child_chains).prev;
                    (local_4d0->child_chains).prev = (list_head *)pcVar12;
                    *(list_head **)local_4d8->out = &local_4d0->child_chains;
                    *(list_head **)(local_4d8->out + 8) = plVar2;
                    plVar2->next = (list_head *)pcVar12;
                  }
                  else {
                    local_4d0->chains[iVar8] = (ip_chain_t *)local_4d8;
                  }
                }
                else {
                  local_4d8 = (ip_rule_t *)0x0;
                  uVar23 = extraout_XMM0_Da_00;
                  uVar24 = extraout_XMM0_Db_00;
                }
              }
              else {
                bVar6 = false;
                if (!bVar22) goto LAB_0010411b;
                local_4b8 = (char *)0x0;
                local_4d8 = (ip_rule_t *)new(0x70);
                local_4d8->target = 6;
                local_450 = &local_4d8->list;
                (local_4d8->list).prev = local_450;
                (local_4d8->list).next = local_450;
                local_458 = &local_4d8->matchs;
                (local_4d8->matchs).prev = local_458;
                (local_4d8->matchs).next = local_458;
                pcVar12 = strtok(&local_438," \t\n");
                uVar23 = extraout_XMM0_Da_04;
                uVar24 = extraout_XMM0_Db_04;
                if (pcVar12 != (char *)0x0) {
                  local_480 = local_4d8->out;
                  local_488 = local_4d8->in;
                  local_460 = &local_4d8->dst;
                  local_468 = &local_4d8->dmsk;
                  local_470 = &local_4d8->src;
                  local_478 = &local_4d8->smsk;
                  local_490 = (long *)0x0;
                  iVar8 = 0;
                  do {
                    local_4b8 = pcVar12;
                    if (*pcVar12 != '-') {
                      if ((*pcVar12 == '!') && (pcVar12[1] == '\0')) {
                        iVar8 = 1;
                      }
                      goto LAB_00104078;
                    }
                    if (((pcVar12[1] != '-') && (pcVar12[1] != 'f')) &&
                       (local_4b8 = strtok((char *)0x0," \t\n"), uVar23 = extraout_XMM0_Da_05,
                       uVar24 = extraout_XMM0_Db_05, local_4b8 == (char *)0x0)) {
LAB_00104143:
                      _log((double)CONCAT44(uVar24,uVar23));
                      free_rule(local_4d8);
                      local_4d8 = (ip_rule_t *)0x0;
                      uVar23 = extraout_XMM0_Da_26;
                      uVar24 = extraout_XMM0_Db_26;
                      break;
                    }
                    __nptr = local_4b8;
                    cVar1 = pcVar12[1];
                    switch(cVar1) {
                    case 'd':
                      iVar10 = parse_ip(local_4b8,local_460,local_468);
                      uVar23 = extraout_XMM0_Da_06;
                      uVar24 = extraout_XMM0_Db_06;
                      if (iVar10 != 0) goto LAB_00104143;
                      bVar19 = 2;
                      break;
                    case 'e':
                    case 'h':
                    case 'k':
                    case 'l':
                    case 'n':
                    case 'q':
                    case 'r':
                      goto switchD_00103cc5_caseD_65;
                    case 'f':
                      local_4d8->frag = '\x01';
                      bVar19 = 0x20;
                      break;
                    case 'g':
                      piVar13 = find_chain(local_4b8,local_4d0);
                      local_4d8->target_child = piVar13;
                      uVar23 = extraout_XMM0_Da_13;
                      uVar24 = extraout_XMM0_Db_13;
                      if (piVar13 == (ip_chain_t *)0x0) goto LAB_00104143;
                      local_4d8->target = 5;
                      local_4d8->go = '\x01';
                      goto switchD_00103cc5_caseD_65;
                    case 'i':
                      sVar15 = strlen(local_4b8);
                      uVar23 = extraout_XMM0_Da_15;
                      uVar24 = extraout_XMM0_Db_15;
                      if (0xf < sVar15) goto LAB_00104143;
                      _strlcpy(local_488,__nptr,0x10);
                      bVar19 = 4;
                      break;
                    case 'j':
                      iVar10 = map_int_get_v(local_4b8,m_target);
                      local_4d8->target = iVar10;
                      uVar23 = extraout_XMM0_Da_08;
                      uVar24 = extraout_XMM0_Db_08;
                      if ((iVar10 == 6) && (g_target_map[0].name != (char *)0x0)) {
                        iVar10 = strcmp(__nptr,g_target_map[0].name);
                        piVar20 = g_target_map;
                        if (iVar10 != 0) {
                          piVar20 = g_target_map;
                          uVar23 = extraout_XMM0_Da_09;
                          uVar24 = extraout_XMM0_Db_09;
                          do {
                            if (piVar20[1].name == (char *)0x0) goto LAB_00103dea;
                            iVar10 = strcmp(__nptr,piVar20[1].name);
                            piVar20 = piVar20 + 1;
                            uVar23 = extraout_XMM0_Da_10;
                            uVar24 = extraout_XMM0_Db_10;
                          } while (iVar10 != 0);
                        }
                        piVar14 = (ip_target_t *)new(0x10);
                        local_4d8->target_ext = piVar14;
                        piVar14->map = piVar20;
                        pvVar18 = new(piVar20->data_size);
                        local_4d8->target_ext->data = pvVar18;
                        local_4d8->target = 4;
                        uVar23 = extraout_XMM0_Da_11;
                        uVar24 = extraout_XMM0_Db_11;
                      }
LAB_00103dea:
                      if (local_4d8->target == 6) {
                        piVar13 = find_chain(__nptr,local_4d0);
                        local_4d8->target_child = piVar13;
                        uVar23 = extraout_XMM0_Da_12;
                        uVar24 = extraout_XMM0_Db_12;
                        if (piVar13 != (ip_chain_t *)0x0) {
                          local_4d8->target = 5;
                        }
                      }
                      if (local_4d8->target == 4) {
                        piVar14 = local_4d8->target_ext;
                        if (((piVar14 != (ip_target_t *)0x0) &&
                            (piVar14->map != (ip_target_map_t *)0x0)) &&
                           (p_Var4 = piVar14->map->func_parse,
                           p_Var4 != (_func_int_void_ptr_char_ptr_ptr *)0x0)) {
                          iVar10 = (*p_Var4)(piVar14->data,&local_4b8);
                          uVar23 = extraout_XMM0_Da_23;
                          uVar24 = extraout_XMM0_Db_23;
LAB_00104046:
                          bVar7 = 0;
                          bVar19 = 0;
                          goto LAB_0010404d;
                        }
                        goto switchD_00103cc5_caseD_65;
                      }
                      bVar7 = 0;
                      bVar19 = 0;
                      if (local_4d8->target == 6) goto LAB_00104143;
                      goto LAB_00104055;
                    case 'm':
                      piVar21 = g_match_map;
                      if (g_match_map[0].name == (char *)0x0) {
LAB_00103ffc:
                        plVar17 = (long *)0x0;
                      }
                      else {
                        iVar10 = strcmp(local_4b8,g_match_map[0].name);
                        if (iVar10 != 0) {
                          piVar21 = g_match_map;
                          uVar23 = extraout_XMM0_Da_19;
                          uVar24 = extraout_XMM0_Db_19;
                          do {
                            if (piVar21[1].name == (char *)0x0) goto LAB_00103ffc;
                            iVar10 = strcmp(__nptr,piVar21[1].name);
                            piVar21 = piVar21 + 1;
                            uVar23 = extraout_XMM0_Da_20;
                            uVar24 = extraout_XMM0_Db_20;
                          } while (iVar10 != 0);
                        }
                        plVar17 = (long *)new(0x20);
                        *plVar17 = (long)piVar21;
                        pvVar18 = new(piVar21->data_size);
                        plVar17[1] = (long)pvVar18;
                        plVar2 = (local_4d8->matchs).prev;
                        (local_4d8->matchs).prev = (list_head *)(plVar17 + 2);
                        plVar17[2] = (long)local_458;
                        plVar17[3] = (long)plVar2;
                        plVar2->next = (list_head *)(plVar17 + 2);
                        uVar23 = extraout_XMM0_Da_21;
                        uVar24 = extraout_XMM0_Db_21;
                      }
                      bVar7 = 0;
                      bVar19 = 0;
                      local_490 = plVar17;
                      if (plVar17 == (long *)0x0) goto LAB_00104143;
                      goto LAB_00104055;
                    case 'o':
                      sVar15 = strlen(local_4b8);
                      uVar23 = extraout_XMM0_Da_16;
                      uVar24 = extraout_XMM0_Db_16;
                      if (0xf < sVar15) goto LAB_00104143;
                      _strlcpy(local_480,__nptr,0x10);
                      bVar19 = 8;
                      break;
                    case 'p':
                      uVar9 = map_int_get_v(local_4b8,m_proto);
                      uVar23 = extraout_XMM0_Da_17;
                      uVar24 = extraout_XMM0_Db_17;
                      if (uVar9 == 0xffffffff) {
                        lVar16 = strtol(__nptr,(char **)0x0,10);
                        uVar9 = (uint)lVar16;
                        uVar23 = extraout_XMM0_Da_18;
                        uVar24 = extraout_XMM0_Db_18;
                      }
                      if (0xff < uVar9) goto LAB_00104143;
                      local_4d8->proto = (uint8_t)uVar9;
                      bVar19 = 0x10;
                      break;
                    case 's':
                      iVar10 = parse_ip(local_4b8,local_470,local_478);
                      bVar7 = 1;
                      bVar19 = 1;
                      uVar23 = extraout_XMM0_Da_14;
                      uVar24 = extraout_XMM0_Db_14;
LAB_0010404d:
                      if (iVar10 != 0) goto LAB_00104143;
                      goto LAB_00104055;
                    default:
                      if (cVar1 == '-') {
                        if (local_490 == (long *)0x0) {
                          bVar7 = 0;
                          bVar19 = 0;
                          local_490 = (long *)0x0;
                          goto LAB_00104055;
                        }
                        if ((*local_490 != 0) &&
                           (pcVar3 = *(code **)(*local_490 + 0x18), pcVar3 != (code *)0x0)) {
                          iVar10 = (*pcVar3)(local_490[1],&local_4b8,iVar8);
                          uVar23 = extraout_XMM0_Da_22;
                          uVar24 = extraout_XMM0_Db_22;
                          goto LAB_00104046;
                        }
                      }
                      else if (cVar1 == 'A') {
                        piVar13 = find_chain(local_4b8,local_4d0);
                        local_4d8->chain = piVar13;
                        uVar23 = extraout_XMM0_Da_07;
                        uVar24 = extraout_XMM0_Db_07;
                        if (piVar13 == (ip_chain_t *)0x0) goto LAB_00104143;
                        plVar2 = (piVar13->rules).prev;
                        (piVar13->rules).prev = local_450;
                        (local_4d8->list).next = &piVar13->rules;
                        (local_4d8->list).prev = plVar2;
                        plVar2->next = local_450;
                      }
switchD_00103cc5_caseD_65:
                      bVar7 = 0;
                      bVar19 = 0;
                      goto LAB_00104055;
                    }
                    bVar7 = 1;
LAB_00104055:
                    bVar22 = iVar8 == 0;
                    iVar8 = 0;
                    if (!(bool)(bVar7 ^ 1 | bVar22) && local_4d8 != (ip_rule_t *)0x0) {
                      local_4d8->invert = local_4d8->invert | bVar19;
                    }
LAB_00104078:
                    pcVar12 = strtok((char *)0x0," \t\n");
                    uVar23 = extraout_XMM0_Da_24;
                    uVar24 = extraout_XMM0_Db_24;
                  } while (pcVar12 != (char *)0x0);
                }
              }
              bVar6 = true;
              if (local_4d8 != (ip_rule_t *)0x0) goto LAB_0010411b;
            }
            _log((double)CONCAT44(uVar24,uVar23));
          }
LAB_0010411b:
          pcVar12 = fgets(&local_438,0x400,__stream);
          bVar22 = bVar6;
          if (pcVar12 == (char *)0x0) {
            return piVar11;
          }
        }
        pcVar12 = fgets(&local_438,0x400,__stream);
      } while (pcVar12 != (char *)0x0);
    }
  }
  return piVar11;
}

Assistant:

ip_tables_t *parse_tables(const char *path)
{
	FILE *fp = fopen(path, "r");
	char line[1024] = {0};
	int line_num = 0, in_table = 0;

	ip_tables_t *ipts = NULL;
	ip_table_t *ipt = NULL;

	if (fp == NULL) {
		log_err("open file \"%s\" failed: %m\n", path);
		return NULL;
	}

	ipts = _new(ip_tables_t);

	while (fgets(line, sizeof(line), fp) != NULL) {
		line_num++;

		if (line[0] == '#' || line[0] == '\n') {
			continue;

		} else if (strcmp(line, "COMMIT\n") == 0 && in_table) {
			in_table = 0;

		} else if (line[0] == '*' && !in_table) {
			if ((ipt = parse_table(line, ipts)) == NULL) {
				log_err("line: %d parse table failed\n", line_num);
			} else {
				in_table = 1;
			}

		} else if (line[0] == ':' && in_table) {
			if (parse_chain(line, ipt) == NULL) {
				log_err("line: %d parse chain failed\n", line_num);
			}

		} else if (in_table) {
			if (parse_rule(line, ipt) == NULL) {
				log_err("line: %d parse rule failed\n", line_num);
			}
		}
	}

	return ipts;
}